

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

void swap_screen(Terminal *term,wchar_t which,_Bool reset,_Bool keep_cur_pos)

{
  _Bool _Var1;
  wchar_t wVar2;
  tree234 *screen;
  tree234 *ptVar3;
  pos pVar4;
  truecolour tVar5;
  uint uVar6;
  wchar_t wVar7;
  bool bVar8;
  
  bVar8 = which != L'\0';
  if (term->alt_which != which) {
    if ((((term->erase_to_scrollback == true) && (term->alt_which != L'\0')) &&
        (term->alt_screen != (tree234 *)0x0)) && (term->disptop < L'\0')) {
      uVar6 = term->disptop + term->alt_sblines;
      term->disptop = (int)uVar6 >> 0x1f & uVar6;
    }
    term->alt_which = which;
    screen = term->screen;
    ptVar3 = term->alt_screen;
    term->alt_screen = screen;
    term->screen = ptVar3;
    if (screen == (tree234 *)0x0) {
      wVar7 = L'\0';
    }
    else {
      wVar7 = find_last_nonempty_line(term,screen);
      wVar7 = wVar7 + L'\x01';
    }
    term->alt_sblines = wVar7;
    wVar2 = (term->curs).x;
    if (!keep_cur_pos && (!bVar8 || !reset)) {
      (term->curs).x = term->alt_x;
    }
    term->alt_x = wVar2;
    wVar2 = (term->curs).y;
    if (!keep_cur_pos && (!bVar8 || !reset)) {
      (term->curs).y = term->alt_y;
    }
    term->alt_y = wVar2;
    wVar2 = term->marg_t;
    if (!bVar8 || !reset) {
      term->marg_t = term->alt_t;
    }
    term->alt_t = wVar2;
    wVar2 = term->marg_b;
    if (!bVar8 || !reset) {
      term->marg_b = term->alt_b;
    }
    term->alt_b = wVar2;
    _Var1 = term->dec_om;
    if (!bVar8 || !reset) {
      term->dec_om = term->alt_om;
    }
    term->alt_om = _Var1;
    _Var1 = term->wrap;
    if (!bVar8 || !reset) {
      term->wrap = term->alt_wrap;
    }
    term->alt_wrap = _Var1;
    _Var1 = term->wrapnext;
    if (!bVar8 || !reset) {
      term->wrapnext = term->alt_wnext;
    }
    term->alt_wnext = _Var1;
    _Var1 = term->insert;
    if (!bVar8 || !reset) {
      term->insert = term->alt_ins;
    }
    term->alt_ins = _Var1;
    wVar2 = term->cset;
    if (!bVar8 || !reset) {
      term->cset = term->alt_cset;
    }
    term->alt_cset = wVar2;
    _Var1 = term->utf;
    if (!bVar8 || !reset) {
      term->utf = term->alt_utf;
    }
    term->alt_utf = _Var1;
    wVar2 = term->sco_acs;
    if (!bVar8 || !reset) {
      term->sco_acs = term->alt_sco_acs;
    }
    term->alt_sco_acs = wVar2;
    pVar4 = term->savecurs;
    if (!bVar8 || !reset) {
      term->savecurs = term->alt_savecurs;
    }
    term->alt_savecurs = pVar4;
    wVar2 = term->save_cset;
    if (!bVar8 || !reset) {
      term->save_cset = term->alt_save_cset;
    }
    term->alt_save_cset = wVar2;
    wVar2 = term->save_csattr;
    if (!bVar8 || !reset) {
      term->save_csattr = term->alt_save_csattr;
    }
    term->alt_save_csattr = wVar2;
    wVar2 = term->save_attr;
    if (!bVar8 || !reset) {
      term->save_attr = term->alt_save_attr;
    }
    term->alt_save_attr = wVar2;
    tVar5 = term->save_truecolour;
    if (!bVar8 || !reset) {
      term->save_truecolour = term->alt_save_truecolour;
    }
    term->alt_save_truecolour = tVar5;
    _Var1 = term->save_utf;
    if (!bVar8 || !reset) {
      term->save_utf = term->alt_save_utf;
    }
    term->alt_save_utf = _Var1;
    _Var1 = term->save_wnext;
    if (!bVar8 || !reset) {
      term->save_wnext = term->alt_save_wnext;
    }
    term->alt_save_wnext = _Var1;
    wVar2 = term->save_sco_acs;
    if (!bVar8 || !reset) {
      term->save_sco_acs = term->alt_save_sco_acs;
    }
    term->alt_save_sco_acs = wVar2;
    if (((term->erase_to_scrollback == true) && (term->alt_screen != (tree234 *)0x0)) &&
       ((term->alt_which != L'\0' && (term->disptop < L'\0')))) {
      term->disptop = term->disptop - wVar7;
      wVar7 = sblines(term);
      if (SBORROW4(term->disptop,-wVar7) != term->disptop + wVar7 < 0) {
        term->disptop = -wVar7;
      }
    }
  }
  if ((bVar8 && reset) && (term->screen != (tree234 *)0x0)) {
    erase_lots(term,false,true,true);
    return;
  }
  return;
}

Assistant:

static void swap_screen(Terminal *term, int which,
                        bool reset, bool keep_cur_pos)
{
    int t;
    bool bt;
    pos tp;
    truecolour ttc;
    tree234 *ttr;

    if (!which)
        reset = false;                 /* do no weird resetting if which==0 */

    if (which != term->alt_which) {
        if (term->erase_to_scrollback && term->alt_screen &&
            term->alt_which && term->disptop < 0) {
            /*
             * We're swapping away from the alternate screen, so some
             * lines are about to vanish from the virtual scrollback.
             * Adjust disptop by that much, so that (if we're not
             * resetting the scrollback anyway on a display event) the
             * current scroll position still ends up pointing at the
             * same text.
             */
            term->disptop += term->alt_sblines;
            if (term->disptop > 0)
                term->disptop = 0;
        }

        term->alt_which = which;

        ttr = term->alt_screen;
        term->alt_screen = term->screen;
        term->screen = ttr;
        term->alt_sblines = (
            term->alt_screen ?
            find_last_nonempty_line(term, term->alt_screen) + 1 : 0);
        t = term->curs.x;
        if (!reset && !keep_cur_pos)
            term->curs.x = term->alt_x;
        term->alt_x = t;
        t = term->curs.y;
        if (!reset && !keep_cur_pos)
            term->curs.y = term->alt_y;
        term->alt_y = t;
        t = term->marg_t;
        if (!reset) term->marg_t = term->alt_t;
        term->alt_t = t;
        t = term->marg_b;
        if (!reset) term->marg_b = term->alt_b;
        term->alt_b = t;
        bt = term->dec_om;
        if (!reset) term->dec_om = term->alt_om;
        term->alt_om = bt;
        bt = term->wrap;
        if (!reset) term->wrap = term->alt_wrap;
        term->alt_wrap = bt;
        bt = term->wrapnext;
        if (!reset) term->wrapnext = term->alt_wnext;
        term->alt_wnext = bt;
        bt = term->insert;
        if (!reset) term->insert = term->alt_ins;
        term->alt_ins = bt;
        t = term->cset;
        if (!reset) term->cset = term->alt_cset;
        term->alt_cset = t;
        bt = term->utf;
        if (!reset) term->utf = term->alt_utf;
        term->alt_utf = bt;
        t = term->sco_acs;
        if (!reset) term->sco_acs = term->alt_sco_acs;
        term->alt_sco_acs = t;

        tp = term->savecurs;
        if (!reset)
            term->savecurs = term->alt_savecurs;
        term->alt_savecurs = tp;
        t = term->save_cset;
        if (!reset)
            term->save_cset = term->alt_save_cset;
        term->alt_save_cset = t;
        t = term->save_csattr;
        if (!reset)
            term->save_csattr = term->alt_save_csattr;
        term->alt_save_csattr = t;
        t = term->save_attr;
        if (!reset)
            term->save_attr = term->alt_save_attr;
        term->alt_save_attr = t;
        ttc = term->save_truecolour;
        if (!reset)
            term->save_truecolour = term->alt_save_truecolour;
        term->alt_save_truecolour = ttc;
        bt = term->save_utf;
        if (!reset)
            term->save_utf = term->alt_save_utf;
        term->alt_save_utf = bt;
        bt = term->save_wnext;
        if (!reset)
            term->save_wnext = term->alt_save_wnext;
        term->alt_save_wnext = bt;
        t = term->save_sco_acs;
        if (!reset)
            term->save_sco_acs = term->alt_save_sco_acs;
        term->alt_save_sco_acs = t;

        if (term->erase_to_scrollback && term->alt_screen &&
            term->alt_which && term->disptop < 0) {
            /*
             * Inverse of the adjustment at the top of this function.
             * This time, we're swapping _to_ the alternate screen, so
             * some lines are about to _appear_ in the virtual
             * scrollback, and we adjust disptop in the other
             * direction.
             *
             * Both these adjustments depend on the value stored in
             * term->alt_sblines while the alt screen is selected,
             * which is why we had to do one _before_ switching away
             * from it and the other _after_ switching to it.
             */
            term->disptop -= term->alt_sblines;
            int limit = -sblines(term);
            if (term->disptop < limit)
                term->disptop = limit;
        }
    }

    if (reset && term->screen) {
        /*
         * Yes, this _is_ supposed to honour background-colour-erase.
         */
        erase_lots(term, false, true, true);
    }
}